

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                 *this,GetterYs<unsigned_long_long> *getter1,GetterYRef *getter2,
                TransformerLinLog *transformer,ImU32 col)

{
  double dVar1;
  double dVar2;
  unsigned_long_long uVar3;
  double dVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  GetterYRef *pGVar7;
  TransformerLinLog *pTVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  int iVar11;
  ImVec2 IVar12;
  ImVec2 IVar13;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar11 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar11 = iVar5;
  }
  this->Prims = iVar11 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar10 = GImPlot;
  (this->P12).y = 0.0;
  dVar1 = getter1->XScale;
  dVar2 = getter1->X0;
  uVar3 = *(unsigned_long_long *)
           ((long)getter1->Ys +
           (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride);
  dVar9 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar5 = transformer->YAxis;
  pIVar6 = pIVar10->CurrentPlot;
  dVar4 = pIVar6->YAxis[iVar5].Range.Min;
  IVar12.x = (float)(((dVar1 * 0.0 + dVar2) - (pIVar6->XAxis).Range.Min) * pIVar10->Mx +
                    (double)pIVar10->PixelRange[iVar5].Min.x);
  IVar12.y = (float)((((double)(float)(dVar9 / pIVar10->LogDenY[iVar5]) *
                       (pIVar6->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) *
                     pIVar10->My[iVar5] + (double)pIVar10->PixelRange[iVar5].Min.y);
  this->P11 = IVar12;
  pIVar10 = GImPlot;
  pGVar7 = this->Getter2;
  dVar1 = pGVar7->XScale;
  dVar2 = pGVar7->X0;
  pTVar8 = this->Transformer;
  dVar9 = log10(pGVar7->YRef / GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar6 = pIVar10->CurrentPlot;
  dVar4 = pIVar6->YAxis[iVar5].Range.Min;
  IVar13.x = (float)(((dVar1 * 0.0 + dVar2) - (pIVar6->XAxis).Range.Min) * pIVar10->Mx +
                    (double)pIVar10->PixelRange[iVar5].Min.x);
  IVar13.y = (float)((((double)(float)(dVar9 / pIVar10->LogDenY[iVar5]) *
                       (pIVar6->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) *
                     pIVar10->My[iVar5] + (double)pIVar10->PixelRange[iVar5].Min.y);
  this->P12 = IVar13;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }